

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O0

bool sptk::ComputePercentagePointOfTDistribution
               (double probability,int degrees_of_freedom,double *percentage_point)

{
  double dVar1;
  double dVar2;
  initializer_list<int> __l;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  double *in_RSI;
  int in_EDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double dVar7;
  double delta;
  double tmp3;
  double tmp2;
  double tmp1;
  double percentage_point_squared;
  double computed_probability;
  double n;
  int i_1;
  double inverse_degrees_of_freedom;
  int j;
  int index;
  int i;
  vector<double,_std::allocator<double>_> term;
  vector<int,_std::allocator<int>_> parameters;
  double z_squared;
  double z;
  allocator_type *in_stack_fffffffffffffe60;
  size_type in_stack_fffffffffffffe68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe70;
  value_type vVar8;
  allocator_type *in_stack_fffffffffffffe78;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe80;
  double *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  int iVar9;
  undefined1 *percentage_point_00;
  double local_128;
  int local_114;
  int local_108;
  int local_104;
  int local_100;
  undefined1 local_f9;
  vector<double,_std::allocator<double>_> local_f8;
  double *in_stack_ffffffffffffff20;
  double in_stack_ffffffffffffff28;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  undefined8 *local_58;
  undefined8 local_50;
  vector<int,_std::allocator<int>_> local_48;
  double local_30;
  double local_28;
  double *local_20;
  int local_14;
  double local_10;
  byte local_1;
  
  local_10 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  if ((((local_10 <= 0.0) || (1.0 <= local_10)) || (in_EDI < 1)) || (in_RSI == (double *)0x0)) {
    local_1 = 0;
    goto LAB_00110777;
  }
  if ((local_10 == 0.5) && (!NAN(local_10))) {
    *in_RSI = 0.0;
    local_1 = 1;
    goto LAB_00110777;
  }
  local_20 = in_RSI;
  local_14 = in_EDI;
  bVar3 = ComputePercentagePointOfStandardNormalDistribution
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  if (!bVar3) {
    local_1 = 0;
    goto LAB_00110777;
  }
  local_30 = local_28 * local_28;
  local_78 = 0xfffff90a000003a2;
  uStack_70 = 0x4623fffffd03;
  local_88 = 0x16800fffffc4f;
  uStack_80 = 0x1530000001b;
  local_98 = 0x3080000004f;
  uStack_90 = 0xfffff880000005ca;
  local_a8 = 0x1100000013;
  uStack_a0 = 0x180fffffff1;
  local_b8 = 0x300000010;
  uStack_b0 = 0x300000060;
  local_c8 = 0x100000001;
  uStack_c0 = 0x500000004;
  local_68 = 0x5a000;
  local_58 = &local_c8;
  local_50 = 0x19;
  std::allocator<int>::allocator((allocator<int> *)0x1101f8);
  __l._M_len._0_4_ = in_stack_fffffffffffffe90;
  __l._M_array = (iterator)in_stack_fffffffffffffe88;
  __l._M_len._4_4_ = in_stack_fffffffffffffe94;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffe80,__l,in_stack_fffffffffffffe78);
  std::allocator<int>::~allocator((allocator<int> *)0x110229);
  percentage_point_00 = &local_f9;
  std::allocator<double>::allocator((allocator<double> *)0x11023b);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  std::allocator<double>::~allocator((allocator<double> *)0x110261);
  local_100 = 0;
  local_104 = 0;
  while( true ) {
    iVar9 = local_100;
    sVar4 = std::vector<double,_std::allocator<double>_>::size(&local_f8);
    if ((int)sVar4 <= iVar9) break;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_104);
    in_stack_fffffffffffffe88 = (double *)(double)*pvVar5;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_f8,(long)local_100);
    *pvVar6 = (value_type)in_stack_fffffffffffffe88;
    iVar9 = local_104;
    for (local_108 = 0; local_104 = iVar9 + 1, local_108 <= local_100; local_108 = local_108 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_f8,(long)local_100);
      vVar8 = *pvVar6;
      dVar7 = local_30;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_104);
      dVar7 = vVar8 * dVar7 + (double)*pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_f8,(long)local_100);
      *pvVar6 = dVar7;
      iVar9 = local_104;
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_104);
    dVar7 = (double)*pvVar5;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_f8,(long)local_100);
    *pvVar6 = *pvVar6 / dVar7;
    local_100 = local_100 + 1;
    local_104 = iVar9 + 2;
  }
  dVar7 = (double)local_14;
  *local_20 = 0.0;
  sVar4 = std::vector<double,_std::allocator<double>_>::size(&local_f8);
  local_114 = (int)sVar4;
  while (local_114 = local_114 + -1, -1 < local_114) {
    in_stack_fffffffffffffe60 = (allocator_type *)*local_20;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_f8,(long)local_114);
    *local_20 = ((double)in_stack_fffffffffffffe60 + *pvVar6) * (1.0 / dVar7);
  }
  *local_20 = (*local_20 + 1.0) * local_28;
  dVar7 = (double)local_14;
  dVar1 = log10(1.0 - local_10);
  dVar1 = pow(dVar1,2.0);
  if (dVar1 + 3.0 < dVar7) {
LAB_00110739:
    local_1 = 1;
  }
  else {
    dVar7 = (double)(local_14 + 1);
    bVar3 = ComputeProbabilityOfTDistribution
                      ((double)percentage_point_00,iVar9,in_stack_fffffffffffffe88);
    if (bVar3) {
      dVar1 = log(dVar7 / ((double)local_14 + *local_20 * *local_20));
      dVar2 = log((double)local_14 / (dVar7 * 6.283185307179586));
      dVar7 = exp((((dVar7 * dVar1 + dVar2) - 1.0) - 1.0 / (dVar7 * 6.0 * (double)local_14)) / 2.0);
      *local_20 = *local_20 - (local_128 - (1.0 - local_10)) / dVar7;
      goto LAB_00110739;
    }
    local_1 = 0;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60);
LAB_00110777:
  return (bool)(local_1 & 1);
}

Assistant:

bool ComputePercentagePointOfTDistribution(double probability,
                                           int degrees_of_freedom,
                                           double* percentage_point) {
  if (probability <= 0.0 || 1.0 <= probability || degrees_of_freedom <= 0 ||
      NULL == percentage_point) {
    return false;
  }

  if (0.5 == probability) {
    *percentage_point = 0.0;
    return true;
  }

  double z;
  if (!ComputePercentagePointOfStandardNormalDistribution(probability, &z)) {
    return false;
  }
  const double z_squared(z * z);
  const std::vector<int> parameters{1,     1,     4,     5,     16,  3,   96,
                                    3,     19,    17,    -15,   384, 79,  776,
                                    1482,  -1920, -945,  92160, 27,  339, 930,
                                    -1782, -765,  17955, 368640};

  std::vector<double> term(5);
  for (int i(0), index(0); i < static_cast<int>(term.size()); ++i) {
    term[i] = parameters[index++];
    for (int j(0); j <= i; ++j) {
      term[i] = term[i] * z_squared + parameters[index++];
    }
    term[i] /= parameters[index++];
  }

  const double inverse_degrees_of_freedom(1.0 / degrees_of_freedom);
  *percentage_point = 0.0;
  for (int i(static_cast<int>(term.size()) - 1); 0 <= i; --i) {
    *percentage_point =
        (*percentage_point + term[i]) * inverse_degrees_of_freedom;
  }
  *percentage_point = (*percentage_point + 1.0) * z;

  if (degrees_of_freedom <=
      std::pow(std::log10(1.0 - probability), 2.0) + 3.0) {
    const double n(degrees_of_freedom + 1);
    double computed_probability;
    if (!ComputeProbabilityOfTDistribution(
            *percentage_point, degrees_of_freedom, &computed_probability)) {
      return false;
    }
    const double percentage_point_squared(*percentage_point *
                                          *percentage_point);
    const double tmp1(
        std::log(n / (degrees_of_freedom + percentage_point_squared)));
    const double tmp2(std::log(degrees_of_freedom / (n * sptk::kTwoPi)));
    const double tmp3(1.0 / (6.0 * n * degrees_of_freedom));
    const double delta((computed_probability - (1.0 - probability)) /
                       std::exp((n * tmp1 + tmp2 - 1.0 - tmp3) / 2.0));
    *percentage_point -= delta;
  }
  return true;
}